

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O0

int IDASetNonlinearSolver(void *ida_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  SUNNonlinearSolver in_RSI;
  IDAMem in_RDI;
  int retval;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x31,"IDASetNonlinearSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    IDAProcessError((IDAMem)0x0,-0x16,0x39,"IDASetNonlinearSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                    ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    IDAProcessError(in_RDI,-0x16,0x42,"IDASetNonlinearSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                    ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else {
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      if ((in_RDI->NLS != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLS != 0)) {
        SUNNonlinSolFree(in_RDI->NLS);
      }
      in_RDI->NLS = in_RSI;
      in_RDI->ownNLS = 0;
      iVar1 = SUNNonlinSolSetSysFn(in_RDI->NLS,idaNlsResidual);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLS,idaNlsConvTest,in_RDI);
        if (iVar1 == 0) {
          iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLS,4);
          if (iVar1 == 0) {
            if (in_RDI->ida_res == (IDAResFn)0x0) {
              IDAProcessError(in_RDI,-0x16,0x7a,"IDASetNonlinearSolver",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                              ,"The DAE residual function is NULL");
              local_4 = -0x16;
            }
            else {
              in_RDI->nls_res = in_RDI->ida_res;
              local_4 = 0;
            }
          }
          else {
            IDAProcessError(in_RDI,-0x16,0x72,"IDASetNonlinearSolver",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                            ,"Setting maximum number of nonlinear iterations failed");
            local_4 = -0x16;
          }
        }
        else {
          IDAProcessError(in_RDI,-0x16,0x69,"IDASetNonlinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                          ,"Setting convergence test function failed");
          local_4 = -0x16;
        }
      }
      else {
        IDAProcessError(in_RDI,-0x16,0x60,"IDASetNonlinearSolver",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                        ,"Setting nonlinear system function failed");
        local_4 = -0x16;
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x4a,"IDASetNonlinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                      ,"NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDASetNonlinearSolver(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLS != NULL) && (IDA_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLS = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLS = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLS, idaNlsResidual);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLS, idaNlsConvTest, ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLS, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* Set the nonlinear system RES function */
  if (!(IDA_mem->ida_res))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The DAE residual function is NULL");
    return (IDA_ILL_INPUT);
  }
  IDA_mem->nls_res = IDA_mem->ida_res;

  return (IDA_SUCCESS);
}